

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

void Fraig_NodeVecPushOrderByLevel(Fraig_NodeVec_t *p,Fraig_Node_t *pNode)

{
  Fraig_Node_t *pFVar1;
  int iVar2;
  int local_2c;
  int i;
  Fraig_Node_t *pNode2;
  Fraig_Node_t *pNode1;
  Fraig_Node_t *pNode_local;
  Fraig_NodeVec_t *p_local;
  
  Fraig_NodeVecPush(p,pNode);
  iVar2 = p->nSize;
  while( true ) {
    local_2c = iVar2 + -1;
    if (local_2c < 1) {
      return;
    }
    pFVar1 = p->pArray[local_2c];
    if (*(int *)(((ulong)pFVar1 & 0xfffffffffffffffe) + 8) <=
        *(int *)(((ulong)p->pArray[iVar2 + -2] & 0xfffffffffffffffe) + 8)) break;
    p->pArray[local_2c] = p->pArray[iVar2 + -2];
    p->pArray[iVar2 + -2] = pFVar1;
    iVar2 = local_2c;
  }
  return;
}

Assistant:

void Fraig_NodeVecPushOrderByLevel( Fraig_NodeVec_t * p, Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1, * pNode2;
    int i;
    Fraig_NodeVecPush( p, pNode );
    // find the p of the node
    for ( i = p->nSize-1; i > 0; i-- )
    {
        pNode1 = p->pArray[i  ];
        pNode2 = p->pArray[i-1];
        if ( Fraig_Regular(pNode1)->Level <= Fraig_Regular(pNode2)->Level )
            break;
        p->pArray[i  ] = pNode2;
        p->pArray[i-1] = pNode1;
    }
}